

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# protocol.cc
# Opt level: O2

vector<unsigned_char,_std::allocator<unsigned_char>_> * __thiscall
event::as_stream(vector<unsigned_char,_std::allocator<unsigned_char>_> *__return_storage_ptr__,
                event *this)

{
  uchar *buf;
  __normal_iterator<const_unsigned_char_*,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
  __first;
  uint uVar1;
  uint32_t uVar2;
  _Vector_base<unsigned_char,_std::allocator<unsigned_char>_> local_30;
  uchar local_14 [4];
  
  (__return_storage_ptr__->super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>).
  _M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  (__return_storage_ptr__->super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>).
  _M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  (__return_storage_ptr__->super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>).
  _M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  uVar1 = (*this->_vptr_event[2])(this);
  local_30._M_impl.super__Vector_impl_data._M_start._0_4_ =
       uVar1 >> 0x18 | (uVar1 & 0xff0000) >> 8 | (uVar1 & 0xff00) << 8 | uVar1 << 0x18;
  (anonymous_namespace)::append_bytes<unsigned_char_const(*)[4]>
            (__return_storage_ptr__,(uchar (*) [4])&local_30);
  (anonymous_namespace)::append_bytes<unsigned_char_const(*)[1]>
            (__return_storage_ptr__,(uchar (*) [1])&this->event_type);
  uVar1 = this->event_no;
  local_30._M_impl.super__Vector_impl_data._M_start._0_4_ =
       uVar1 >> 0x18 | (uVar1 & 0xff0000) >> 8 | (uVar1 & 0xff00) << 8 | uVar1 << 0x18;
  (anonymous_namespace)::append_bytes<unsigned_char_const(*)[4]>
            (__return_storage_ptr__,(uchar (*) [4])&local_30);
  (*this->_vptr_event[4])(&local_30,this);
  __first._M_current._4_4_ = local_30._M_impl.super__Vector_impl_data._M_start._4_4_;
  __first._M_current._0_4_ = (uint)local_30._M_impl.super__Vector_impl_data._M_start;
  std::vector<unsigned_char,std::allocator<unsigned_char>>::
  insert<__gnu_cxx::__normal_iterator<unsigned_char_const*,std::vector<unsigned_char,std::allocator<unsigned_char>>>,void>
            ((vector<unsigned_char,std::allocator<unsigned_char>> *)__return_storage_ptr__,
             (const_iterator)
             (__return_storage_ptr__->
             super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>)._M_impl.
             super__Vector_impl_data._M_finish,__first,
             (__normal_iterator<const_unsigned_char_*,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
              )local_30._M_impl.super__Vector_impl_data._M_finish);
  buf = (__return_storage_ptr__->super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>).
        _M_impl.super__Vector_impl_data._M_start;
  uVar2 = xcrc32(buf,*(int *)&(__return_storage_ptr__->
                              super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>).
                              _M_impl.super__Vector_impl_data._M_finish - (int)buf,0);
  local_14 = (uchar  [4])
             (uVar2 >> 0x18 | (uVar2 & 0xff0000) >> 8 | (uVar2 & 0xff00) << 8 | uVar2 << 0x18);
  (anonymous_namespace)::append_bytes<unsigned_char_const(*)[4]>(__return_storage_ptr__,&local_14);
  std::vector<unsigned_char,_std::allocator<unsigned_char>_>::_M_shrink_to_fit
            (__return_storage_ptr__);
  std::_Vector_base<unsigned_char,_std::allocator<unsigned_char>_>::~_Vector_base(&local_30);
  return __return_storage_ptr__;
}

Assistant:

std::vector<std::uint8_t> event::as_stream() const
{
	std::vector<std::uint8_t> stream;

	append_bytes(stream, as_bytes(htonl(calculate_len())));
	append_bytes(stream, as_bytes(event_type));
	append_bytes(stream, as_bytes(htonl(event_no)));

	const auto& aux_data = aux_as_stream();
	stream.insert(stream.end(), aux_data.begin(), aux_data.end());

	auto crc =	xcrc32(stream.data(), stream.size(), 0);
	append_bytes(stream, as_bytes(htonl(crc)));

	stream.shrink_to_fit();
	return stream;
}